

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O1

int Map_MatchNodePhase(Map_Man_t *p,Map_Node_t *pNode,int fPhase)

{
  Map_Super_t **ppMVar1;
  int iVar2;
  Map_Time_t *pMVar3;
  int iVar4;
  Map_Match_t *pMVar5;
  long lVar6;
  Map_Cut_t *pCut;
  float fVar7;
  Map_Match_t MatchBest;
  Map_Cut_t *local_70;
  Map_Match_t local_68;
  Map_Node_t *local_40;
  long local_38;
  
  lVar6 = (long)fPhase;
  local_70 = pNode->pCutBest[lVar6];
  if (p->fMappingMode != 0 && local_70 == (Map_Cut_t *)0x0) {
    return 1;
  }
  if (p->fMappingMode != 0) {
    Map_TimeCutComputeArrival(pNode,local_70,fPhase,3.4028235e+37);
  }
  if (p->fMappingMode - 2U < 2) {
    pMVar5 = local_70->M + lVar6;
    if ((pNode->nRefAct[lVar6] < 1) &&
       ((pNode->pCutBest[fPhase == 0] != (Map_Cut_t *)0x0 || (pNode->nRefAct[fPhase == 0] < 1)))) {
      fVar7 = Map_CutGetAreaDerefed(local_70,fPhase);
    }
    else {
      fVar7 = Map_CutDeref(local_70,fPhase);
    }
  }
  else {
    if (p->fMappingMode != 4) goto LAB_00365460;
    pMVar5 = local_70->M + lVar6;
    if ((pNode->nRefAct[lVar6] < 1) &&
       ((pNode->pCutBest[fPhase == 0] != (Map_Cut_t *)0x0 || (pNode->nRefAct[fPhase == 0] < 1)))) {
      fVar7 = Map_SwitchCutGetDerefed(pNode,local_70,fPhase);
    }
    else {
      fVar7 = Map_SwitchCutDeref(pNode,local_70,fPhase);
    }
  }
  pMVar5->AreaFlow = fVar7;
LAB_00365460:
  if (local_70 == (Map_Cut_t *)0x0) {
    local_68.pSuperBest = (Map_Super_t *)0x0;
    local_68.pSupers = (Map_Super_t *)0x0;
    local_68.uPhase = 0;
    local_68.uPhaseBest = 0;
    local_68.tArrive.Rise = 3.4028235e+37;
    local_68.tArrive.Fall = 3.4028235e+37;
    local_68.tArrive.Worst = 3.4028235e+37;
    local_68.AreaFlow = 3.4028235e+37;
  }
  else {
    local_68._32_8_ = *(undefined8 *)&local_70->M[lVar6].tArrive.Worst;
    pMVar5 = local_70->M + lVar6;
    local_68.pSupers = pMVar5->pSupers;
    local_68.uPhase = pMVar5->uPhase;
    local_68.uPhaseBest = pMVar5->uPhaseBest;
    ppMVar1 = &local_70->M[lVar6].pSuperBest;
    local_68.pSuperBest = *ppMVar1;
    pMVar3 = (Map_Time_t *)(ppMVar1 + 1);
    local_68.tArrive.Rise = pMVar3->Rise;
    local_68.tArrive.Fall = pMVar3->Fall;
  }
  pCut = pNode->pCuts->pNext;
  local_38 = lVar6;
  if (pCut != (Map_Cut_t *)0x0) {
    fVar7 = pNode->tRequired[lVar6].Worst;
    local_40 = pNode;
    do {
      if (((p->fSkipFanout == 0) ||
          (((pNode->nRefs < 4 || (pCut->nLeaves < '\x03')) &&
           ((pNode->nRefs < 2 || (pCut->nLeaves < '\x04')))))) &&
         (pCut->M[lVar6].pSupers != (Map_Super_t *)0x0)) {
        pMVar5 = pCut->M + lVar6;
        Map_MatchNodeCut(p,pNode,pCut,fPhase,fVar7);
        if ((pMVar5->pSuperBest != (Map_Super_t *)0x0) &&
           ((pMVar5->tArrive).Worst <= p->fEpsilon + fVar7)) {
          iVar2 = p->fMappingMode;
          iVar4 = Map_MatchCompare(p,&local_68,pMVar5,iVar2);
          pNode = local_40;
          if (iVar4 != 0) {
            local_68._32_8_ = *(undefined8 *)&(pMVar5->tArrive).Worst;
            local_68.pSupers = pMVar5->pSupers;
            local_68.uPhase = pMVar5->uPhase;
            local_68.uPhaseBest = pMVar5->uPhaseBest;
            local_68.pSuperBest = pMVar5->pSuperBest;
            local_68.tArrive.Rise = (pMVar5->tArrive).Rise;
            local_68.tArrive.Fall = (pMVar5->tArrive).Fall;
            local_70 = pCut;
            if (iVar2 == 0) {
              fVar7 = local_68.tArrive.Worst;
            }
          }
        }
      }
      pCut = pCut->pNext;
    } while (pCut != (Map_Cut_t *)0x0);
  }
  if (local_70 != (Map_Cut_t *)0x0) {
    pNode->pCutBest[local_38] = local_70;
    *(undefined8 *)&local_70->M[local_38].tArrive.Worst = local_68._32_8_;
    ppMVar1 = &local_70->M[local_38].pSuperBest;
    *ppMVar1 = local_68.pSuperBest;
    pMVar3 = (Map_Time_t *)(ppMVar1 + 1);
    pMVar3->Rise = local_68.tArrive.Rise;
    pMVar3->Fall = local_68.tArrive.Fall;
    pMVar5 = local_70->M + local_38;
    pMVar5->pSupers = local_68.pSupers;
    pMVar5->uPhase = local_68.uPhase;
    pMVar5->uPhaseBest = local_68.uPhaseBest;
    iVar2 = p->fMappingMode;
    if ((1 < iVar2) &&
       ((0 < pNode->nRefAct[local_38] ||
        ((pNode->pCutBest[fPhase == 0] == (Map_Cut_t *)0x0 && (0 < pNode->nRefAct[fPhase == 0]))))))
    {
      if (iVar2 - 2U < 2) {
        Map_CutRef(pNode->pCutBest[local_38],fPhase);
      }
      else {
        if (iVar2 != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperMatch.c"
                        ,0x14d,"int Map_MatchNodePhase(Map_Man_t *, Map_Node_t *, int)");
        }
        Map_SwitchCutRef(pNode,pNode->pCutBest[local_38],fPhase);
      }
    }
  }
  return 1;
}

Assistant:

int Map_MatchNodePhase( Map_Man_t * p, Map_Node_t * pNode, int fPhase )
{
    Map_Match_t MatchBest, * pMatch;
    Map_Cut_t * pCut, * pCutBest;
    float Area1 = 0.0; // Suppress "might be used uninitialized
    float Area2, fWorstLimit;

    // skip the cuts that have been unassigned during area recovery
    pCutBest = pNode->pCutBest[fPhase];
    if ( p->fMappingMode != 0 && pCutBest == NULL )
        return 1;

    // recompute the arrival times of the current best match 
    // because the arrival times of the fanins may have changed 
    // as a result of remapping fanins in the topological order
    if ( p->fMappingMode != 0 )
    {
        Map_TimeCutComputeArrival( pNode, pCutBest, fPhase, MAP_FLOAT_LARGE );
        // make sure that the required times are met
//        assert( pCutBest->M[fPhase].tArrive.Rise < pNode->tRequired[fPhase].Rise + p->fEpsilon );
//        assert( pCutBest->M[fPhase].tArrive.Fall < pNode->tRequired[fPhase].Fall + p->fEpsilon );
    }

    // recompute the exact area of the current best match
    // because the exact area of the fanins may have changed
    // as a result of remapping fanins in the topological order
    if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
    {
        pMatch = pCutBest->M + fPhase;
        if ( pNode->nRefAct[fPhase] > 0 || 
            (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0) )
            pMatch->AreaFlow = Area1 = Map_CutDeref( pCutBest, fPhase );
        else
            pMatch->AreaFlow = Area1 = Map_CutGetAreaDerefed( pCutBest, fPhase );
    }
    else if ( p->fMappingMode == 4 )
    {
        pMatch = pCutBest->M + fPhase;
        if ( pNode->nRefAct[fPhase] > 0 || 
            (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0) )
            pMatch->AreaFlow = Area1 = Map_SwitchCutDeref( pNode, pCutBest, fPhase );
        else
            pMatch->AreaFlow = Area1 = Map_SwitchCutGetDerefed( pNode, pCutBest, fPhase );
    }

    // save the old mapping
    if ( pCutBest )
        MatchBest = pCutBest->M[fPhase];
    else
        Map_MatchClean( &MatchBest );
 
    // select the new best cut
    fWorstLimit = pNode->tRequired[fPhase].Worst;
    for ( pCut = pNode->pCuts->pNext; pCut; pCut = pCut->pNext )
    {
        // limit gate sizes based on fanout count
        if ( p->fSkipFanout && ((pNode->nRefs > 3 && pCut->nLeaves > 2) || (pNode->nRefs > 1 && pCut->nLeaves > 3)) )
            continue;
        pMatch = pCut->M + fPhase;
        if ( pMatch->pSupers == NULL )
            continue;

        // find the matches for the cut
        Map_MatchNodeCut( p, pNode, pCut, fPhase, fWorstLimit );
        if ( pMatch->pSuperBest == NULL || pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
            continue;

        // if the cut can be matched compare the matchings
        if ( Map_MatchCompare( p, &MatchBest, pMatch, p->fMappingMode ) )
        {
            pCutBest  =  pCut;
            MatchBest = *pMatch;
            // if we are mapping for delay, the worst-case limit should be tightened
            if ( p->fMappingMode == 0 )
                fWorstLimit = MatchBest.tArrive.Worst;
        }
    }

    if ( pCutBest == NULL )
        return 1;

    // set the new mapping
    pNode->pCutBest[fPhase] = pCutBest;
    pCutBest->M[fPhase]     = MatchBest;

    // reference the new cut if it used
    if ( p->fMappingMode >= 2 && 
         (pNode->nRefAct[fPhase] > 0 || 
         (pNode->pCutBest[!fPhase] == NULL && pNode->nRefAct[!fPhase] > 0)) )
    {
        if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
            Area2 = Map_CutRef( pNode->pCutBest[fPhase], fPhase );
        else if ( p->fMappingMode == 4 )
            Area2 = Map_SwitchCutRef( pNode, pNode->pCutBest[fPhase], fPhase );
        else 
            assert( 0 );
//        assert( Area2 < Area1 + p->fEpsilon );
    }

    // make sure that the requited times are met
//    assert( MatchBest.tArrive.Rise < pNode->tRequired[fPhase].Rise + p->fEpsilon );
//    assert( MatchBest.tArrive.Fall < pNode->tRequired[fPhase].Fall + p->fEpsilon );
    return 1;
}